

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  size_type sVar2;
  bool bVar3;
  pair<int,_int> pVar4;
  pointer *__ptr;
  int i;
  int index;
  uint index_00;
  char *in_R9;
  AssertionResult gtest_ar__5;
  hasher hasher;
  AssertionResult gtest_ar_;
  TypeParam ht3;
  TypeParam ht1;
  TypeParam ht2;
  undefined1 local_228 [8];
  undefined8 local_220;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_218;
  AssertHelper local_210;
  Hasher local_208;
  string local_1f8;
  undefined1 local_1d8 [8];
  int *local_1d0;
  char local_1c8 [112];
  pointer local_158;
  HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_148;
  undefined1 local_b8 [8];
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_b0;
  
  local_1d8 = (undefined1  [8])0x0;
  local_1d0 = (int *)((ulong)local_1d0 & 0xffffffff00000000);
  local_1f8._M_dataplus._M_p = (pointer)0x0;
  local_1f8._M_string_length = local_1f8._M_string_length & 0xffffffff00000000;
  local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffff00000000);
  local_b0.settings.
  super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (&local_148,0,(hasher *)local_1d8,(key_equal *)&local_1f8,(allocator_type *)local_b8);
  local_1f8._M_dataplus._M_p = (pointer)0x0;
  local_1f8._M_string_length = local_1f8._M_string_length & 0xffffffff00000000;
  local_228._0_4_ = 0;
  local_228._4_4_ = 0;
  local_220 = (undefined8 *)((ulong)local_220._4_4_ << 0x20);
  local_1d8 = (undefined1  [8])((ulong)local_1d8 & 0xffffffff00000000);
  local_1d0 = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_b8,0,(hasher *)&local_1f8,(key_equal *)local_228,(allocator_type *)local_1d8);
  this_00 = &local_148.
             super_BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  bVar3 = google::
          dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_1f8._M_dataplus._M_p._0_1_ = bVar3;
  local_1f8._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_1f8,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42e,(char *)local_1d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((pair<int,_int>)local_228 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_228 + 8))();
    }
  }
  sVar2 = local_1f8._M_string_length;
  if ((undefined8 *)local_1f8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1f8._M_string_length !=
        (undefined8 *)(local_1f8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_1f8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  bVar3 = google::
          dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_1f8._M_dataplus._M_p._0_1_ = bVar3;
  local_1f8._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_1f8,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42f,(char *)local_1d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((pair<int,_int>)local_228 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_228 + 8))();
    }
  }
  sVar2 = local_1f8._M_string_length;
  if ((undefined8 *)local_1f8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1f8._M_string_length !=
        (undefined8 *)(local_1f8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_1f8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(1);
  google::
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  local_148.
  super_BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey.first = -pVar4.first;
  local_148.
  super_BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.settings.
  super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_148.
  super_BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey.second = (int)(-((ulong)pVar4 & 0xffffffff00000000) >> 0x20);
  bVar3 = google::
          dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_1f8._M_dataplus._M_p._0_1_ = bVar3;
  local_1f8._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_1f8,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x432,(char *)local_1d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((pair<int,_int>)local_228 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_228 + 8))();
    }
  }
  sVar2 = local_1f8._M_string_length;
  if ((undefined8 *)local_1f8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1f8._M_string_length !=
        (undefined8 *)(local_1f8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_1f8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  bVar3 = google::
          dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_1f8._M_dataplus._M_p._0_1_ = bVar3;
  local_1f8._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_1f8,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x433,(char *)local_1d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((pair<int,_int>)local_228 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_228 + 8))();
    }
  }
  sVar2 = local_1f8._M_string_length;
  if ((undefined8 *)local_1f8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1f8._M_string_length !=
        (undefined8 *)(local_1f8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_1f8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  google::
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize(this_00,2000);
  bVar3 = google::
          dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_1f8._M_dataplus._M_p._0_1_ = bVar3;
  local_1f8._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_1f8,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x435,(char *)local_1d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((pair<int,_int>)local_228 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_228 + 8))();
    }
  }
  sVar2 = local_1f8._M_string_length;
  if ((undefined8 *)local_1f8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1f8._M_string_length !=
        (undefined8 *)(local_1f8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_1f8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_208.id_ = 1;
  local_208.num_hashes_ = 0;
  local_208.num_compares_ = 0;
  local_1f8._M_dataplus._M_p._0_4_ = 2;
  local_1f8._M_string_length = 0;
  google::
  HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_1d8,5,(hasher *)&local_208,(key_equal *)&local_208,
             (allocator_type *)&local_1f8);
  bVar3 = google::
          dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,(dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                *)&local_1d0);
  local_228[0] = bVar3;
  local_220 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_228,(AssertionResult *)"ht1 == ht3","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43b,local_1f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,(dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                *)&local_1d0);
  local_228[0] = bVar3;
  local_220 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_228,(AssertionResult *)"ht1 != ht3","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43c,local_1f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  local_228 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(2);
  google::
  dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert<std::pair<int,int>const&>
            ((pair<google::dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)&local_1f8,
             (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,(pair<int,_int> *)local_228);
  bVar3 = google::
          dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_228[0] = !bVar3;
  local_220 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_228,(AssertionResult *)"ht1 != ht2","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43f,local_1f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_228[0] = !bVar3;
  local_220 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_228,(AssertionResult *)"ht1 == ht2","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x440,local_1f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  local_228 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(2);
  google::
  dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert<std::pair<int,int>const&>
            ((pair<google::dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)&local_1f8,
             (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)&local_b0,(pair<int,_int> *)local_228);
  bVar3 = google::
          dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_228[0] = bVar3;
  local_220 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_228,(AssertionResult *)"ht1 == ht2","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x443,local_1f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  index = 3;
  do {
    local_228 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(index);
    google::
    dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert<std::pair<int,int>const&>
              ((pair<google::dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)&local_1f8,
               (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)this_00,(pair<int,_int> *)local_228);
    index = index + 1;
  } while (index != 0x7d1);
  index_00 = 0x7d1;
  do {
    index_00 = index_00 - 1;
    local_228 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(index_00);
    google::
    dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert<std::pair<int,int>const&>
              ((pair<google::dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)&local_1f8,
               (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)&local_b0,(pair<int,_int> *)local_228);
  } while (3 < index_00);
  bVar3 = google::
          dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_228[0] = bVar3;
  local_220 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_228,(AssertionResult *)"ht1 == ht2","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,1099,local_1f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  local_1d8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c27508;
  if (local_158 != (pointer)0x0) {
    free(local_158);
  }
  local_b8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c27508;
  if (local_b0.table != (pointer)0x0) {
    free(local_b0.table);
  }
  local_148.
  super_BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c27508;
  if (local_148.
      super_BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_148.
         super_BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}